

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_neon_addl_saturate(TCGContext_conflict1 *tcg_ctx,TCGv_i64 op0,TCGv_i64 op1,int size)

{
  TCGv_ptr pTVar1;
  uintptr_t o;
  code *func;
  TCGTemp *local_18;
  TCGTemp *local_10;
  TCGv_i64 local_8;
  
  if (size == 2) {
    pTVar1 = tcg_ctx->cpu_env;
    func = helper_neon_addl_saturate_s64_aarch64;
  }
  else {
    if (size != 1) {
      abort();
    }
    pTVar1 = tcg_ctx->cpu_env;
    func = helper_neon_addl_saturate_s32_aarch64;
  }
  local_8 = op1 + (long)tcg_ctx;
  local_18 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  local_10 = (TCGTemp *)(op0 + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,func,local_10,3,&local_18);
  return;
}

Assistant:

static inline void gen_neon_addl_saturate(TCGContext *tcg_ctx, TCGv_i64 op0, TCGv_i64 op1, int size)
{
    switch (size) {
    case 1: gen_helper_neon_addl_saturate_s32(tcg_ctx, op0, tcg_ctx->cpu_env, op0, op1); break;
    case 2: gen_helper_neon_addl_saturate_s64(tcg_ctx, op0, tcg_ctx->cpu_env, op0, op1); break;
    default: abort();
    }
}